

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_asvp.c
# Opt level: O2

void * ares_htable_asvp_get_direct(ares_htable_asvp_t *htable,ares_socket_t key)

{
  void *val;
  void *local_10;
  
  local_10 = (void *)0x0;
  ares_htable_asvp_get(htable,key,&local_10);
  return local_10;
}

Assistant:

void *ares_htable_asvp_get_direct(const ares_htable_asvp_t *htable,
                                  ares_socket_t             key)
{
  void *val = NULL;
  ares_htable_asvp_get(htable, key, &val);
  return val;
}